

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

Vector * VectorTriangleNormal(Vector v1,Vector v2,Vector v3)

{
  Vector v1_00;
  Vector v1_01;
  Vector v1_02;
  Vector v;
  Vector v2_00;
  Vector v2_01;
  Vector v2_02;
  Vector *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 *puVar1;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar1 = &stack0x00000008;
  v1_00.z._8_8_ = in_stack_00000008;
  v1_00._0_40_ = v2._0_40_;
  v2_00.z._8_8_ = puVar1;
  v2_00._0_40_ = v1._0_40_;
  VectorSubtraction(v1_00,v2_00);
  v1_01.z._8_8_ = *puVar1;
  v1_01._0_40_ = v3._0_40_;
  v2_01.z._8_8_ = puVar1;
  v2_01._0_40_ = *(undefined1 (*) [40])(puVar1 + 1);
  VectorSubtraction(v1_01,v2_01);
  v1_02.x._8_8_ = local_58;
  v1_02.x._0_8_ = uStack_60;
  v1_02.y._0_8_ = uStack_50;
  v1_02.y._8_8_ = local_48;
  v1_02.z._0_8_ = uStack_40;
  v1_02.z._8_8_ = local_98;
  v2_02.x._8_8_ = local_88;
  v2_02.x._0_8_ = uStack_90;
  v2_02.y._0_8_ = uStack_80;
  v2_02.y._8_8_ = local_78;
  v2_02.z._0_8_ = uStack_70;
  v2_02.z._8_8_ = puVar1;
  VectorCrossProduct(v1_02,v2_02);
  v.x._8_8_ = local_28;
  v.x._0_8_ = uStack_30;
  v.y._0_8_ = uStack_20;
  v.y._8_8_ = local_18;
  v.z._0_8_ = uStack_10;
  v.z._8_8_ = local_98;
  VectorL2Normalization(v);
  return in_RDI;
}

Assistant:

Vector VectorTriangleNormal(const Vector v1, const Vector v2, const Vector v3) { return VectorL2Normalization(VectorCrossProduct(VectorSubtraction(v2, v1), VectorSubtraction(v3, v1))); }